

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TypeParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool&,bool&,slang::ast::ForwardTypeRestriction&>
          (BumpAllocator *this,Scope *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          SourceLocation *args_2,bool *args_3,bool *args_4,ForwardTypeRestriction *args_5)

{
  string_view name;
  TypeParameterSymbol *pTVar1;
  Scope *in_RCX;
  TypeParameterSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  undefined2 uVar2;
  char *unaff_retaddr;
  ForwardTypeRestriction in_stack_00000018;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  uVar2 = (undefined2)((ulong)in_R8 >> 0x30);
  pTVar1 = (TypeParameterSymbol *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::TypeParameterSymbol::TypeParameterSymbol
            (in_RDX,in_RCX,name,in_RSI,SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0),in_stack_00000018)
  ;
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }